

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tableref.cpp
# Opt level: O2

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> __thiscall
duckdb::TableRef::Deserialize(TableRef *this,Deserializer *deserializer)

{
  _func_int **pp_Var1;
  unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true> __p;
  TableReferenceType TVar2;
  optional_idx oVar3;
  pointer pTVar4;
  SerializationException *this_00;
  allocator local_69;
  undefined1 local_68 [32];
  unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true> sample;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> alias;
  
  TVar2 = Deserializer::ReadProperty<duckdb::TableReferenceType>(deserializer,100,"type");
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>(&alias,deserializer,0x65,"alias");
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::SampleOptions,std::default_delete<duckdb::SampleOptions>,true>>
            ((Deserializer *)&sample,(field_id_t)deserializer,(char *)0x66);
  oVar3 = Deserializer::ReadPropertyWithExplicitDefault<duckdb::optional_idx>
                    (deserializer,0x67,"query_location",(optional_idx)0xffffffffffffffff);
  this->_vptr_TableRef = (_func_int **)0x0;
  switch(TVar2) {
  case BASE_TABLE:
    BaseTableRef::Deserialize((BaseTableRef *)local_68,deserializer);
    break;
  case SUBQUERY:
    SubqueryRef::Deserialize((SubqueryRef *)local_68,deserializer);
    break;
  case JOIN:
    JoinRef::Deserialize((JoinRef *)local_68,deserializer);
    break;
  default:
    this_00 = (SerializationException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)local_68,"Unsupported type for deserialization of TableRef!",&local_69);
    SerializationException::SerializationException(this_00,(string *)local_68);
    __cxa_throw(this_00,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
  case TABLE_FUNCTION:
    TableFunctionRef::Deserialize((TableFunctionRef *)local_68,deserializer);
    break;
  case EXPRESSION_LIST:
    ExpressionListRef::Deserialize((ExpressionListRef *)local_68,deserializer);
    break;
  case EMPTY_FROM:
    EmptyTableRef::Deserialize((Deserializer *)local_68);
    break;
  case PIVOT:
    PivotRef::Deserialize((PivotRef *)local_68,deserializer);
    break;
  case SHOW_REF:
    ShowRef::Deserialize((ShowRef *)local_68,deserializer);
    break;
  case COLUMN_DATA:
    ColumnDataRef::Deserialize((ColumnDataRef *)local_68,deserializer);
  }
  pp_Var1 = this->_vptr_TableRef;
  this->_vptr_TableRef = (_func_int **)local_68._0_8_;
  if (pp_Var1 != (_func_int **)0x0) {
    (**(code **)(*pp_Var1 + 8))();
  }
  pTVar4 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator->
                     ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
                      this);
  ::std::__cxx11::string::operator=((string *)&pTVar4->alias,(string *)&alias);
  pTVar4 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator->
                     ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
                      this);
  __p = sample;
  sample.super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
  super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>.
  super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl =
       (unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>)
       (__uniq_ptr_data<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true,_true>
        )0x0;
  ::std::__uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>::reset
            ((__uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_> *)
             &pTVar4->sample,
             (pointer)__p.
                      super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>
                      ._M_t.
                      super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>
                      .super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl);
  pTVar4 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator->
                     ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
                      this);
  (pTVar4->query_location).index = oVar3.index;
  ::std::unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>::~unique_ptr
            (&sample.
              super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>);
  ::std::__cxx11::string::~string((string *)&alias);
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)this;
}

Assistant:

unique_ptr<TableRef> TableRef::Deserialize(Deserializer &deserializer) {
	auto type = deserializer.ReadProperty<TableReferenceType>(100, "type");
	auto alias = deserializer.ReadPropertyWithDefault<string>(101, "alias");
	auto sample = deserializer.ReadPropertyWithDefault<unique_ptr<SampleOptions>>(102, "sample");
	auto query_location = deserializer.ReadPropertyWithExplicitDefault<optional_idx>(103, "query_location", optional_idx());
	unique_ptr<TableRef> result;
	switch (type) {
	case TableReferenceType::BASE_TABLE:
		result = BaseTableRef::Deserialize(deserializer);
		break;
	case TableReferenceType::COLUMN_DATA:
		result = ColumnDataRef::Deserialize(deserializer);
		break;
	case TableReferenceType::EMPTY_FROM:
		result = EmptyTableRef::Deserialize(deserializer);
		break;
	case TableReferenceType::EXPRESSION_LIST:
		result = ExpressionListRef::Deserialize(deserializer);
		break;
	case TableReferenceType::JOIN:
		result = JoinRef::Deserialize(deserializer);
		break;
	case TableReferenceType::PIVOT:
		result = PivotRef::Deserialize(deserializer);
		break;
	case TableReferenceType::SHOW_REF:
		result = ShowRef::Deserialize(deserializer);
		break;
	case TableReferenceType::SUBQUERY:
		result = SubqueryRef::Deserialize(deserializer);
		break;
	case TableReferenceType::TABLE_FUNCTION:
		result = TableFunctionRef::Deserialize(deserializer);
		break;
	default:
		throw SerializationException("Unsupported type for deserialization of TableRef!");
	}
	result->alias = std::move(alias);
	result->sample = std::move(sample);
	result->query_location = query_location;
	return result;
}